

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

void leveldb::PutVarint64(string *dst,uint64_t v)

{
  char *ptr;
  char buf [10];
  uint64_t v_local;
  string *dst_local;
  
  buf._2_8_ = v;
  EncodeVarint64((char *)((long)&ptr + 6),v);
  std::__cxx11::string::append((char *)dst,(long)&ptr + 6);
  return;
}

Assistant:

void PutVarint64(std::string* dst, uint64_t v) {
  char buf[10];
  char* ptr = EncodeVarint64(buf, v);
  dst->append(buf, ptr - buf);
}